

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)

{
  LocalRootParameterType LVar1;
  pointer puVar2;
  pointer pLVar3;
  bool bVar4;
  uint32_t uVar5;
  String *__str;
  LoggingCallback p_Var6;
  void *pvVar7;
  dxil_spv_result dVar8;
  char *__ptr;
  LocalRootParameter *local_param;
  pointer pLVar9;
  pointer pFVar10;
  unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_> *opt;
  pointer puVar11;
  size_t sStack_10a0;
  Converter dxil_converter;
  SPIRVModule module;
  uint32_t driver_version;
  uint32_t driver_id;
  ConvertedFunction entry_point;
  _Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  local_1050;
  char buffer [4096];
  
  dxil_spv::SPIRVModule::SPIRVModule(&module);
  dxil_spv::Converter::Converter
            (&dxil_converter,converter->bc_parser,converter->bc_reflection_parser,&module);
  if ((converter->entry_point)._M_string_length != 0) {
    dxil_spv::Converter::set_entry_point(&dxil_converter,(converter->entry_point)._M_dataplus._M_p);
  }
  dxil_spv::Converter::set_resource_remapping_interface
            (&dxil_converter,&(converter->remapper).super_ResourceRemappingInterface);
  puVar2 = (converter->options).
           super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (converter->options).
                 super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1
      ) {
    dxil_spv::Converter::add_option
              (&dxil_converter,
               (puVar11->_M_t).
               super___uniq_ptr_impl<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::OptionBase_*,_std::default_delete<dxil_spv::OptionBase>_>
               .super__Head_base<0UL,_dxil_spv::OptionBase_*,_false>._M_head_impl);
  }
  pLVar3 = (converter->local_root_parameters).
           super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar9 = (converter->local_root_parameters).
                super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar9 != pLVar3; pLVar9 = pLVar9 + 1) {
    LVar1 = pLVar9->type;
    if (LVar1 == Table) {
      std::
      vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
      ::vector((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                *)&local_1050,&pLVar9->table_entries);
      dxil_spv::Converter::add_local_root_descriptor_table
                (&dxil_converter,(Vector<DescriptorTableEntry> *)&local_1050);
      std::
      _Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
      ::~_Vector_base(&local_1050);
    }
    else if (LVar1 == Descriptor) {
      dxil_spv::Converter::add_local_root_descriptor
                (&dxil_converter,(pLVar9->local_descriptor).resource_class,
                 (pLVar9->local_descriptor).register_space,(pLVar9->local_descriptor).register_index
                );
    }
    else if (LVar1 == Constants) {
      dxil_spv::Converter::add_local_root_constants
                (&dxil_converter,(pLVar9->local_constants).register_space,
                 (pLVar9->local_constants).register_index,(pLVar9->local_constants).num_words);
    }
  }
  dxil_spv::Converter::convert_entry_point(&entry_point,&dxil_converter);
  if (entry_point.entry.entry == (CFGNode *)0x0) {
    p_Var6 = dxil_spv::get_thread_log_callback();
    if (p_Var6 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"t function.\n",0xd);
      buffer[0] = 'F';
      buffer[1] = 'a';
      buffer[2] = 'i';
      buffer[3] = 'l';
      buffer[4] = 'e';
      buffer[5] = 'd';
      buffer[6] = ' ';
      buffer[7] = 't';
      buffer[8] = 'o';
      buffer[9] = ' ';
      buffer[10] = 'c';
      buffer[0xb] = 'o';
      buffer[0xc] = 'n';
      buffer[0xd] = 'v';
      buffer[0xe] = 'e';
      buffer[0xf] = 'r';
      goto LAB_00107528;
    }
    __ptr = "[ERROR]: Failed to convert function.\n";
    sStack_10a0 = 0x25;
LAB_001075ac:
    fwrite(__ptr,sStack_10a0,1,_stderr);
    fflush(_stderr);
  }
  else {
    dxil_spv::CFGStructurizer::CFGStructurizer
              ((CFGStructurizer *)buffer,entry_point.entry.entry,
               (CFGNodePool *)
               entry_point.node_pool._M_t.
               super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
               .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&module);
    bVar4 = dxil_spv::Converter::get_driver_version(&dxil_converter,&driver_id,&driver_version);
    if (bVar4) {
      dxil_spv::CFGStructurizer::set_driver_version
                ((CFGStructurizer *)buffer,driver_id,driver_version);
    }
    dxil_spv::SPIRVModule::set_entry_build_point(&module,entry_point.entry.func);
    dxil_spv::CFGStructurizer::run((CFGStructurizer *)buffer);
    dxil_spv::SPIRVModule::emit_entry_point_function_body(&module,(CFGStructurizer *)buffer);
    dxil_spv::CFGStructurizer::~CFGStructurizer((CFGStructurizer *)buffer);
    for (pFVar10 = entry_point.leaf_functions.
                   super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pFVar10 !=
        entry_point.leaf_functions.
        super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
        ._M_impl.super__Vector_impl_data._M_finish; pFVar10 = pFVar10 + 1) {
      if (pFVar10->entry == (CFGNode *)0x0) {
        p_Var6 = dxil_spv::get_thread_log_callback();
        if (p_Var6 != (LoggingCallback)0x0) {
          builtin_strncpy(buffer + 0x10," nullptr!\n",0xb);
          buffer[0] = 'L';
          buffer[1] = 'e';
          buffer[2] = 'a';
          buffer[3] = 'f';
          buffer[4] = ' ';
          buffer[5] = 'f';
          buffer[6] = 'u';
          buffer[7] = 'n';
          buffer[8] = 'c';
          buffer[9] = 't';
          buffer[10] = 'i';
          buffer[0xb] = 'o';
          buffer[0xc] = 'n';
          buffer[0xd] = ' ';
          buffer[0xe] = 'i';
          buffer[0xf] = 's';
          goto LAB_00107528;
        }
        __ptr = "[ERROR]: Leaf function is nullptr!\n";
        sStack_10a0 = 0x23;
        goto LAB_001075ac;
      }
      dxil_spv::CFGStructurizer::CFGStructurizer
                ((CFGStructurizer *)buffer,pFVar10->entry,
                 (CFGNodePool *)
                 entry_point.node_pool._M_t.
                 super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
                 .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&module);
      dxil_spv::SPIRVModule::set_entry_build_point(&module,pFVar10->func);
      dxil_spv::CFGStructurizer::run((CFGStructurizer *)buffer);
      dxil_spv::SPIRVModule::emit_leaf_function_body
                (&module,pFVar10->func,(CFGStructurizer *)buffer);
      dxil_spv::CFGStructurizer::~CFGStructurizer((CFGStructurizer *)buffer);
    }
    bVar4 = dxil_spv::SPIRVModule::finalize_spirv(&module,&converter->spirv);
    if (bVar4) {
      __str = dxil_spv::Converter::get_compiled_entry_point_abi_cxx11_(&dxil_converter);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_assign
                (&converter->compiled_entry_point,__str);
      bVar4 = dxil_spv::SPIRVModule::has_builtin_shader_input(&module,BuiltInSubgroupSize);
      converter->uses_subgroup_size = bVar4;
      dxil_spv::Converter::get_workgroup_dimensions
                (&dxil_converter,converter->workgroup_size,converter->workgroup_size + 1,
                 converter->workgroup_size + 2);
      dxil_spv::Converter::get_compute_wave_size_range
                (&dxil_converter,&converter->wave_size_min,&converter->wave_size_max,
                 &converter->wave_size_preferred);
      uVar5 = dxil_spv::Converter::get_compute_heuristic_max_wave_size(&dxil_converter);
      converter->heuristic_wave_size = uVar5;
      uVar5 = dxil_spv::Converter::get_patch_vertex_count(&dxil_converter);
      converter->patch_vertex_count = uVar5;
      dVar8 = DXIL_SPV_SUCCESS;
      bVar4 = dxil_spv::Converter::shader_requires_feature(&dxil_converter,Native16BitOperations);
      converter->shader_feature_used[0] = bVar4;
      dxil_spv::Converter::get_analysis_warnings_abi_cxx11_((String *)buffer,&dxil_converter);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&converter->analysis_warnings,(String *)buffer);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                ((String *)buffer);
      goto LAB_0010753f;
    }
    p_Var6 = dxil_spv::get_thread_log_callback();
    if (p_Var6 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Failed to finalize SPIR-V.\n";
      sStack_10a0 = 0x24;
      goto LAB_001075ac;
    }
    builtin_strncpy(buffer + 0x10,"ze SPIR-V.\n",0xc);
    buffer[0] = 'F';
    buffer[1] = 'a';
    buffer[2] = 'i';
    buffer[3] = 'l';
    buffer[4] = 'e';
    buffer[5] = 'd';
    buffer[6] = ' ';
    buffer[7] = 't';
    buffer[8] = 'o';
    buffer[9] = ' ';
    buffer[10] = 'f';
    buffer[0xb] = 'i';
    buffer[0xc] = 'n';
    buffer[0xd] = 'a';
    buffer[0xe] = 'l';
    buffer[0xf] = 'i';
LAB_00107528:
    pvVar7 = dxil_spv::get_thread_log_callback_userdata();
    (*p_Var6)(pvVar7,Error,buffer);
  }
  dVar8 = DXIL_SPV_ERROR_GENERIC;
LAB_0010753f:
  dxil_spv::ConvertedFunction::~ConvertedFunction(&entry_point);
  dxil_spv::Converter::~Converter(&dxil_converter);
  dxil_spv::SPIRVModule::~SPIRVModule(&module);
  return dVar8;
}

Assistant:

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)
{
	SPIRVModule module;
	Converter dxil_converter(converter->bc_parser, converter->bc_reflection_parser, module);

	if (!converter->entry_point.empty())
		dxil_converter.set_entry_point(converter->entry_point.c_str());
	dxil_converter.set_resource_remapping_interface(&converter->remapper);
	for (auto &opt : converter->options)
		dxil_converter.add_option(*opt);

	for (auto &local_param : converter->local_root_parameters)
	{
		switch (local_param.type)
		{
		case LocalRootParameterType::Constants:
			dxil_converter.add_local_root_constants(local_param.local_constants.register_space,
			                                        local_param.local_constants.register_index,
			                                        local_param.local_constants.num_words);
			break;

		case LocalRootParameterType::Descriptor:
			dxil_converter.add_local_root_descriptor(local_param.local_descriptor.resource_class,
			                                         local_param.local_descriptor.register_space,
			                                         local_param.local_descriptor.register_index);
			break;

		case LocalRootParameterType::Table:
			dxil_converter.add_local_root_descriptor_table(local_param.table_entries);
			break;
		}
	}

	auto entry_point = dxil_converter.convert_entry_point();

	if (entry_point.entry.entry == nullptr)
	{
		LOGE("Failed to convert function.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	{
		dxil_spv::CFGStructurizer structurizer(entry_point.entry.entry, *entry_point.node_pool, module);
		uint32_t driver_id, driver_version;
		if (dxil_converter.get_driver_version(driver_id, driver_version))
			structurizer.set_driver_version(driver_id, driver_version);
		module.set_entry_build_point(entry_point.entry.func);
		structurizer.run();
		module.emit_entry_point_function_body(structurizer);
	}

	for (auto &leaf : entry_point.leaf_functions)
	{
		if (!leaf.entry)
		{
			LOGE("Leaf function is nullptr!\n");
			return DXIL_SPV_ERROR_GENERIC;
		}
		dxil_spv::CFGStructurizer structurizer(leaf.entry, *entry_point.node_pool, module);
		module.set_entry_build_point(leaf.func);
		structurizer.run();
		module.emit_leaf_function_body(leaf.func, structurizer);
	}

	if (!module.finalize_spirv(converter->spirv))
	{
		LOGE("Failed to finalize SPIR-V.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	converter->compiled_entry_point = dxil_converter.get_compiled_entry_point();
	converter->uses_subgroup_size = module.has_builtin_shader_input(spv::BuiltInSubgroupSize);
	dxil_converter.get_workgroup_dimensions(converter->workgroup_size[0],
	                                        converter->workgroup_size[1],
	                                        converter->workgroup_size[2]);
	dxil_converter.get_compute_wave_size_range(converter->wave_size_min, converter->wave_size_max, converter->wave_size_preferred);
	converter->heuristic_wave_size = dxil_converter.get_compute_heuristic_max_wave_size();
	converter->patch_vertex_count = dxil_converter.get_patch_vertex_count();
	for (int i = 0; i < int(ShaderFeature::Count); i++)
		converter->shader_feature_used[i] = dxil_converter.shader_requires_feature(ShaderFeature(i));
	converter->analysis_warnings = dxil_converter.get_analysis_warnings();

	return DXIL_SPV_SUCCESS;
}